

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O0

void __thiscall
ska::detailv3::
sherwood_v3_table<const_slang::ast::InstanceBodySymbol_*,_const_slang::ast::InstanceBodySymbol_*,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>_>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>_>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>_>_>
::rehash(sherwood_v3_table<const_slang::ast::InstanceBodySymbol_*,_const_slang::ast::InstanceBodySymbol_*,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>_>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>_>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>_>_>
         *this,size_t num_buckets)

{
  size_t sVar1;
  char max_lookups;
  sherwood_v3_table<const_slang::ast::InstanceBodySymbol_*,_const_slang::ast::InstanceBodySymbol_*,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>_>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>_>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>_>_>
  *psVar2;
  bool bVar3;
  unsigned_long *puVar4;
  sherwood_v3_table<const_slang::ast::InstanceBodySymbol_*,_const_slang::ast::InstanceBodySymbol_*,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>_>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>_>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>_>_>
  *psVar5;
  EntryPointer psVar6;
  sherwood_v3_table<const_slang::ast::InstanceBodySymbol_*,_const_slang::ast::InstanceBodySymbol_*,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>_>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>_>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>_>_>
  **size;
  double dVar7;
  undefined1 auVar8 [16];
  EntryPointer end;
  EntryPointer it_1;
  pointer psStack_40;
  int8_t old_max_lookups;
  EntryPointer it;
  EntryPointer special_end_item;
  EntryPointer new_buckets;
  int8_t new_max_lookups;
  ulong uStack_20;
  int8_t new_prime_index;
  sherwood_v3_table<const_slang::ast::InstanceBodySymbol_*,_const_slang::ast::InstanceBodySymbol_*,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>_>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>_>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>_>_>
  *local_18;
  size_t num_buckets_local;
  sherwood_v3_table<const_slang::ast::InstanceBodySymbol_*,_const_slang::ast::InstanceBodySymbol_*,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>_>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>_>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>_>_>
  *this_local;
  
  sVar1 = this->num_elements;
  auVar8._8_4_ = (int)(sVar1 >> 0x20);
  auVar8._0_8_ = sVar1;
  auVar8._12_4_ = 0x45300000;
  local_18 = (sherwood_v3_table<const_slang::ast::InstanceBodySymbol_*,_const_slang::ast::InstanceBodySymbol_*,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>_>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>_>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>_>_>
              *)num_buckets;
  num_buckets_local = (size_t)this;
  dVar7 = ceil(((auVar8._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) /
               (double)this->_max_load_factor);
  uStack_20 = (long)dVar7 | (long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f;
  puVar4 = std::max<unsigned_long>((unsigned_long *)&local_18,&stack0xffffffffffffffe0);
  local_18 = (sherwood_v3_table<const_slang::ast::InstanceBodySymbol_*,_const_slang::ast::InstanceBodySymbol_*,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>_>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>_>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>_>_>
              *)*puVar4;
  if (local_18 ==
      (sherwood_v3_table<const_slang::ast::InstanceBodySymbol_*,_const_slang::ast::InstanceBodySymbol_*,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>_>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>_>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>_>_>
       *)0x0) {
    reset_to_empty_state(this);
  }
  else {
    size = &local_18;
    new_buckets._7_1_ = fibonacci_hash_policy::next_size_over(&this->hash_policy,(size_t *)size);
    psVar2 = local_18;
    psVar5 = (sherwood_v3_table<const_slang::ast::InstanceBodySymbol_*,_const_slang::ast::InstanceBodySymbol_*,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>_>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>_>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>_>_>
              *)bucket_count(this);
    if (psVar2 != psVar5) {
      new_buckets._6_1_ = compute_max_lookups(local_18,(size_t)size);
      special_end_item =
           std::
           allocator_traits<std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>_>_>
           ::allocate((allocator_type *)this,(long)&local_18->entries + (long)new_buckets._6_1_);
      for (psStack_40 = special_end_item;
          psStack_40 != special_end_item + (long)local_18 + (long)new_buckets._6_1_ + -1;
          psStack_40 = psStack_40 + 1) {
        psStack_40->distance_from_desired = -1;
      }
      special_end_item[(long)local_18 + (long)new_buckets._6_1_ + -1].distance_from_desired = '\0';
      std::swap<ska::detailv3::sherwood_v3_entry<slang::ast::InstanceBodySymbol_const*>*>
                (&this->entries,&special_end_item);
      std::swap<unsigned_long>(&this->num_slots_minus_one,(unsigned_long *)&local_18);
      this->num_slots_minus_one = this->num_slots_minus_one - 1;
      fibonacci_hash_policy::commit(&this->hash_policy,new_buckets._7_1_);
      max_lookups = this->max_lookups;
      this->max_lookups = new_buckets._6_1_;
      this->num_elements = 0;
      psVar6 = special_end_item + (long)&local_18->entries + (long)max_lookups;
      for (end = special_end_item; end != psVar6; end = end + 1) {
        bVar3 = sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>::has_value(end);
        if (bVar3) {
          sherwood_v3_table<slang::ast::InstanceBodySymbol_const*,slang::ast::InstanceBodySymbol_const*,slang::Hasher<slang::ast::InstanceBodySymbol_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ast::InstanceBodySymbol_const*>>,std::equal_to<slang::ast::InstanceBodySymbol_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::InstanceBodySymbol_const*>>,std::allocator<slang::ast::InstanceBodySymbol_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ast::InstanceBodySymbol_const*>>>
          ::emplace<slang::ast::InstanceBodySymbol_const*>
                    ((sherwood_v3_table<slang::ast::InstanceBodySymbol_const*,slang::ast::InstanceBodySymbol_const*,slang::Hasher<slang::ast::InstanceBodySymbol_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ast::InstanceBodySymbol_const*>>,std::equal_to<slang::ast::InstanceBodySymbol_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::InstanceBodySymbol_const*>>,std::allocator<slang::ast::InstanceBodySymbol_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ast::InstanceBodySymbol_const*>>>
                      *)this,&(end->field_1).value);
          sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>::destroy_value(end);
        }
      }
      deallocate_data(this,special_end_item,(size_t)local_18,max_lookups);
    }
  }
  return;
}

Assistant:

void rehash(size_t num_buckets)
    {
        num_buckets = std::max(num_buckets, static_cast<size_t>(std::ceil(num_elements / static_cast<double>(_max_load_factor))));
        if (num_buckets == 0)
        {
            reset_to_empty_state();
            return;
        }
        auto new_prime_index = hash_policy.next_size_over(num_buckets);
        if (num_buckets == bucket_count())
            return;
        int8_t new_max_lookups = compute_max_lookups(num_buckets);
        EntryPointer new_buckets(AllocatorTraits::allocate(*this, num_buckets + new_max_lookups));
        EntryPointer special_end_item = new_buckets + static_cast<ptrdiff_t>(num_buckets + new_max_lookups - 1);
        for (EntryPointer it = new_buckets; it != special_end_item; ++it)
            it->distance_from_desired = -1;
        special_end_item->distance_from_desired = Entry::special_end_value;
        std::swap(entries, new_buckets);
        std::swap(num_slots_minus_one, num_buckets);
        --num_slots_minus_one;
        hash_policy.commit(new_prime_index);
        int8_t old_max_lookups = max_lookups;
        max_lookups = new_max_lookups;
        num_elements = 0;
        for (EntryPointer it = new_buckets, end = it + static_cast<ptrdiff_t>(num_buckets + old_max_lookups); it != end; ++it)
        {
            if (it->has_value())
            {
                emplace(std::move(it->value));
                it->destroy_value();
            }
        }
        deallocate_data(new_buckets, num_buckets, old_max_lookups);
    }